

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perfect.hpp
# Opt level: O3

void __thiscall
Lib::
Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
::Perfect(Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
          *this,MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *elem)

{
  bool local_58 [8];
  undefined8 uStack_50;
  undefined8 local_48;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *local_38;
  undefined4 *local_30;
  uint local_28 [2];
  Entry *local_20;
  
  local_38 = elem;
  Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  ::tryGet((Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
            *)&local_30,
           (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)
           Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
           ::_ids);
  if (local_30 == (undefined4 *)0x0) {
    local_58[0] = false;
    local_58[1] = false;
    local_58[2] = false;
    local_58[3] = false;
    local_58[4] = false;
    local_58[5] = false;
    local_58[6] = false;
    local_58[7] = false;
    uStack_50 = 0;
    local_48 = 0;
  }
  else {
    local_48 = *(undefined8 *)(local_30 + 2);
    uStack_50 = CONCAT44(uStack_50._4_4_,*local_30);
  }
  local_58[0] = local_30 != (undefined4 *)0x0;
  Option<Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>>
  ::
  unwrapOrElse<Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>::unwrapOrElse(Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>)::_lambda()_1_>
            ((Option<Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>>
              *)local_28,(MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)local_58);
  this->_id = local_28[0];
  this->_ptr = (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)local_20;
  return;
}

Assistant:

explicit Perfect(T elem) 
    : Perfect(_ids.tryGet(&elem).toOwned()
        .unwrapOrElse([&](){
            auto entry = Perfect(_ids.size(),  new T(std::move(elem)));
            _ids.insert(entry._ptr, entry);
            DEBUG(*elemPtr, " -> ", T::className(),"#",entry._id);
            return entry;
          })) 
    { }